

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_GenerateStream(ym3438_t *chip,Bit16s *output,Bit32u numsamples)

{
  Bit16s *pBVar1;
  Bit16s local_24;
  Bit16s local_22;
  Bit16s local_20 [2];
  Bit16s buffer [2];
  Bit32u i;
  Bit32u numsamples_local;
  Bit16s *output_local;
  ym3438_t *chip_local;
  
  local_20[0] = 0;
  local_20[1] = 0;
  buffer = (Bit16s  [2])numsamples;
  _i = output;
  for (; (uint)local_20 < (uint)buffer; local_20 = (Bit16s  [2])((int)local_20 + 1)) {
    OPN2_GenerateResampled(chip,&local_24);
    pBVar1 = _i + 1;
    *_i = local_24;
    _i = _i + 2;
    *pBVar1 = local_22;
  }
  return;
}

Assistant:

void OPN2_GenerateStream(ym3438_t *chip, Bit16s *output, Bit32u numsamples)
{
    Bit32u i;
    Bit16s buffer[2];

    for (i = 0; i < numsamples; i++)
    {
        OPN2_GenerateResampled(chip, buffer);
        *output++ = buffer[0];
        *output++ = buffer[1];
    }
}